

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

QWidget * __thiscall QToolBox::widget(QToolBox *this,int index)

{
  long lVar1;
  const_reference pvVar2;
  
  if (-1 < index) {
    lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
    if (index < (int)((ulong)(*(long *)(lVar1 + 0x280) - *(long *)(lVar1 + 0x278)) >> 3)) {
      pvVar2 = std::
               vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
               ::operator[]((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                             *)(lVar1 + 0x278),(ulong)(uint)index);
      return ((pvVar2->_M_t).
              super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
              ._M_t.
              super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
              .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl)->widget;
    }
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QToolBox::widget(int index) const
{
    Q_D(const QToolBox);
    if (index < 0 || index >= static_cast<int>(d->pageList.size()))
        return nullptr;
    return d->pageList[index]->widget;
}